

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IsSet(cmMakefile *this,string *name)

{
  string_view val;
  bool bVar1;
  ulong uVar2;
  string *this_00;
  cmValue local_28;
  cmValue value;
  string *name_local;
  cmMakefile *this_local;
  
  value.Value = name;
  local_28 = GetDefinition(this,name);
  bVar1 = cmValue::operator_cast_to_bool(&local_28);
  if (bVar1) {
    cmValue::operator->[abi_cxx11_(&local_28);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this_00 = cmValue::operator*[abi_cxx11_(&local_28);
      val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00)
      ;
      bVar1 = cmIsNOTFOUND(val);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::IsSet(const std::string& name) const
{
  cmValue value = this->GetDefinition(name);
  if (!value) {
    return false;
  }

  if (value->empty()) {
    return false;
  }

  if (cmIsNOTFOUND(*value)) {
    return false;
  }

  return true;
}